

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_13::smart_ban_plugin::on_read_failed_block
          (smart_ban_plugin *this,piece_block b,address *a,disk_buffer_holder *buffer,int block_size
          ,storage_error *error)

{
  map<libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
  *this_00;
  size_t *psVar1;
  _Rb_tree_color _Var2;
  torrent_peer *this_01;
  _Base_ptr p_Var3;
  peer_connection_interface *ppVar4;
  torrent *ptVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  piece_block pVar9;
  int iVar10;
  iterator iVar11;
  iterator iVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  address *addr;
  endpoint *ep;
  _Rb_tree_node_base *p_Var17;
  _Alloc_hider _Var18;
  bool bVar19;
  undefined1 auVar20 [16];
  piece_index_t pVar21;
  int iVar22;
  int iVar23;
  span<const_char> data;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar24;
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  piece_block b_local;
  hasher h;
  string local_240;
  data_union local_21c;
  string local_200;
  string local_1e0;
  block_entry e;
  peer_info info;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  
  if ((error->ec).val_ != 0) {
    return;
  }
  p_Var15 = (_Base_ptr)buffer;
  b_local = b;
  lcrypto::hasher::hasher(&h);
  data.m_len = (long)block_size;
  data.m_ptr = buffer->m_buf;
  lcrypto::hasher::update(&h,data);
  aux::torrent::find_peers(&range,this->m_torrent,a);
  if (range.first._M_cur == range.second._M_cur) goto LAB_00346a31;
  this_01 = *range.first._M_cur;
  e.peer = this_01;
  lcrypto::hasher::final(&e.digest,&h);
  this_00 = &this->m_block_hashes;
  iVar11 = ::std::
           map<libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
           ::lower_bound(this_00,&b_local);
  p_Var16 = &(this->m_block_hashes)._M_t._M_impl.super__Rb_tree_header._M_header;
  pVar21 = b_local.piece_index.m_val;
  iVar10 = b_local.block_index;
  if (((iVar11._M_node != p_Var16) &&
      (iVar22 = -(uint)(pVar21.m_val == (_Rb_tree_color)*(undefined8 *)(iVar11._M_node + 1)),
      iVar23 = -(uint)(iVar10 == (int)((ulong)*(undefined8 *)(iVar11._M_node + 1) >> 0x20)),
      auVar20._4_4_ = iVar22, auVar20._0_4_ = iVar22, auVar20._8_4_ = iVar23,
      auVar20._12_4_ = iVar23, iVar22 = movmskpd((int)p_Var16,auVar20), iVar22 == 3)) &&
     ((torrent_peer *)iVar11._M_node[1]._M_parent == this_01)) {
    if ((this_01->field_0x1e & 8) == 0) {
      bVar19 = digest32<160L>::operator!=((digest32<160L> *)&iVar11._M_node[1]._M_left,&e.digest);
      if (bVar19) {
        iVar10 = (*(this->m_torrent->super_request_callback)._vptr_request_callback[6])();
        if ((char)iVar10 != '\0') {
          v1_2::peer_info::peer_info(&info);
          ppVar4 = this_01->connection;
          if (ppVar4 == (peer_connection_interface *)0x0) {
            _Var18._M_p = "-";
          }
          else {
            (*ppVar4->_vptr_peer_connection_interface[0x10])(ppVar4,&info);
            _Var18 = info.client._M_dataplus;
          }
          pVar9 = b_local;
          ptVar5 = this->m_torrent;
          uVar8 = (ulong)b_local >> 0x20;
          in_00.m_len = (difference_type)p_Var15;
          in_00.m_ptr = (char *)0x14;
          aux::to_hex_abi_cxx11_(&local_240,(aux *)&iVar11._M_node[1]._M_left,in_00);
          in_01.m_len = (difference_type)p_Var15;
          in_01.m_ptr = (char *)0x14;
          aux::to_hex_abi_cxx11_(&local_1e0,(aux *)&e.digest,in_01);
          aux::torrent_peer::ip((endpoint *)&local_21c.base,this_01);
          aux::print_endpoint_abi_cxx11_(&local_200,(aux *)&local_21c.base,ep);
          (*(ptVar5->super_request_callback)._vptr_request_callback[7])
                    (ptVar5,
                     "BANNING PEER [ p: %d | b: %d | c: %s | hash1: %s | hash2: %s | ip: %s ]",
                     (ulong)pVar9 & 0xffffffff,uVar8,_Var18._M_p,local_240._M_dataplus._M_p,
                     local_1e0._M_dataplus._M_p,
                     CONCAT44(local_200._M_dataplus._M_p._4_4_,(uint)local_200._M_dataplus._M_p));
          ::std::__cxx11::string::~string((string *)&local_200);
          ::std::__cxx11::string::~string((string *)&local_1e0);
          ::std::__cxx11::string::~string((string *)&local_240);
          v1_2::peer_info::~peer_info(&info);
        }
        aux::torrent::ban_peer(this->m_torrent,this_01);
        ppVar4 = this_01->connection;
        if (ppVar4 != (peer_connection_interface *)0x0) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&info,peer_banned,(type *)0x0);
          (*ppVar4->_vptr_peer_connection_interface[4])(ppVar4,&info,1,0);
        }
      }
    }
    goto LAB_00346a31;
  }
  info.client._M_dataplus._M_p = (pointer)b_local;
  info.client._M_string_length = (size_type)e.peer;
  info.client.field_2._0_4_ = e.digest.m_number._M_elems[0];
  info.client.field_2._4_4_ = e.digest.m_number._M_elems[1];
  info.client.field_2._8_4_ = e.digest.m_number._M_elems[2];
  info.client.field_2._12_4_ = e.digest.m_number._M_elems[3];
  info.pieces.super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (bitfield)(bitfield)e._24_8_;
  if (iVar11._M_node == p_Var16) {
    if ((this->m_block_hashes)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00346874:
      pVar24 = ::std::
               _Rb_tree<libtorrent::piece_block,_std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>,_std::_Select1st<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
               ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)&info);
      goto LAB_0034688a;
    }
    p_Var15 = (this->m_block_hashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if ((pVar21.m_val <= (int)p_Var15[1]._M_color) &&
       ((p_Var15[1]._M_color != pVar21.m_val || (iVar10 <= *(int *)&p_Var15[1].field_0x4))))
    goto LAB_00346874;
    iVar11._M_node = (_Base_ptr)0x0;
LAB_00346789:
    pVar24.second = p_Var15;
    pVar24.first = iVar11._M_node;
LAB_0034688f:
    p_Var17 = pVar24.second;
    bVar19 = true;
    if ((p_Var16 != p_Var17) && (pVar24.first == (_Rb_tree_node_base *)0x0)) {
      if ((int)p_Var17[1]._M_color <= (int)(_Rb_tree_color)info.client._M_dataplus._M_p) {
        if ((_Rb_tree_color)info.client._M_dataplus._M_p == p_Var17[1]._M_color) {
          bVar19 = info.client._M_dataplus._M_p._4_4_ < *(int *)&p_Var17[1].field_0x4;
        }
        else {
          bVar19 = false;
        }
      }
    }
    p_Var14 = (_Rb_tree_node_base *)operator_new(0x48);
    *(bitfield *)(p_Var14 + 2) =
         info.pieces.super_bitfield.m_buf.
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    p_Var14[1]._M_left = (_Base_ptr)info.client.field_2._M_allocated_capacity;
    p_Var14[1]._M_right = (_Base_ptr)info.client.field_2._8_8_;
    *(pointer *)(p_Var14 + 1) = info.client._M_dataplus._M_p;
    p_Var14[1]._M_parent = (_Base_ptr)info.client._M_string_length;
    ::std::_Rb_tree_insert_and_rebalance(bVar19,p_Var14,p_Var17,p_Var16);
    psVar1 = &(this->m_block_hashes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
    p_Var15 = p_Var16;
  }
  else {
    _Var2 = iVar11._M_node[1]._M_color;
    bVar19 = SBORROW4(_Var2,pVar21.m_val);
    iVar22 = _Var2 - pVar21.m_val;
    if (pVar21.m_val < (int)_Var2) {
LAB_0034673d:
      p_Var13 = (this->m_block_hashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar24.second = p_Var13;
      pVar24.first = iVar11._M_node;
      if (p_Var13 != iVar11._M_node) {
        iVar12._M_node = (_Base_ptr)::std::_Rb_tree_decrement(iVar11._M_node);
        if (((int)iVar12._M_node[1]._M_color < pVar21.m_val) ||
           ((iVar12._M_node[1]._M_color == pVar21.m_val &&
            (*(int *)&iVar12._M_node[1].field_0x4 < iVar10)))) {
          p_Var3 = (iVar12._M_node)->_M_right;
joined_r0x003467cd:
          p_Var15 = iVar11._M_node;
          if (p_Var3 != (_Base_ptr)0x0) goto LAB_00346789;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = iVar12._M_node;
          pVar24 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
          goto LAB_0034688f;
        }
        pVar24 = ::std::
                 _Rb_tree<libtorrent::piece_block,_std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>,_std::_Select1st<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
                 ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)&info);
      }
LAB_0034688a:
      if (pVar24.second != (_Rb_tree_node_base *)0x0) goto LAB_0034688f;
    }
    else {
      if (_Var2 == pVar21.m_val) {
        if (iVar10 < *(int *)&iVar11._M_node[1].field_0x4) goto LAB_0034673d;
        bVar19 = SBORROW4(*(int *)&iVar11._M_node[1].field_0x4,iVar10);
        iVar22 = *(int *)&iVar11._M_node[1].field_0x4 - iVar10;
      }
      if (bVar19 != iVar22 < 0) {
        p_Var13 = (this->m_block_hashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        if (p_Var13 == iVar11._M_node) {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = p_Var13;
          pVar24 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar7 << 0x40);
        }
        else {
          p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(iVar11._M_node);
          if ((pVar21.m_val < (int)p_Var13[1]._M_color) ||
             ((p_Var13[1]._M_color == pVar21.m_val && (iVar10 < *(int *)&p_Var13[1].field_0x4)))) {
            p_Var3 = (iVar11._M_node)->_M_right;
            iVar12 = iVar11;
            iVar11._M_node = p_Var13;
            goto joined_r0x003467cd;
          }
          pVar24 = ::std::
                   _Rb_tree<libtorrent::piece_block,_std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>,_std::_Select1st<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
                   ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)&info);
        }
        goto LAB_0034688a;
      }
    }
  }
  iVar10 = (*(this->m_torrent->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar10 != '\0') {
    v1_2::peer_info::peer_info(&info);
    ppVar4 = this_01->connection;
    if (ppVar4 == (peer_connection_interface *)0x0) {
      _Var18._M_p = "-";
    }
    else {
      (*ppVar4->_vptr_peer_connection_interface[0x10])(ppVar4,&info);
      _Var18 = info.client._M_dataplus;
    }
    pVar9 = b_local;
    ptVar5 = this->m_torrent;
    uVar8 = (ulong)b_local >> 0x20;
    in.m_len = (difference_type)p_Var15;
    in.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_(&local_240,(aux *)&e.digest,in);
    aux::torrent_peer::ip((endpoint *)&local_21c.base,this_01);
    if (local_21c.base.sa_family != 2) {
      local_200._M_string_length._0_1_ = local_21c.base.sa_data[6];
      local_200._M_string_length._1_1_ = local_21c.base.sa_data[7];
      local_200._M_string_length._2_1_ = local_21c.base.sa_data[8];
      local_200._M_string_length._3_1_ = local_21c.base.sa_data[9];
      local_200._M_string_length._4_1_ = local_21c.base.sa_data[10];
      local_200._M_string_length._5_1_ = local_21c.base.sa_data[0xb];
      local_200._M_string_length._6_1_ = local_21c.base.sa_data[0xc];
      local_200._M_string_length._7_1_ = local_21c.base.sa_data[0xd];
      local_200.field_2._M_allocated_capacity = local_21c._16_8_;
      local_200.field_2._8_8_ = ZEXT48(local_21c.v6.sin6_scope_id);
      local_21c.v6.sin6_flowinfo = 0;
    }
    else {
      local_200._M_string_length._0_1_ = '\0';
      local_200._M_string_length._1_1_ = '\0';
      local_200._M_string_length._2_1_ = '\0';
      local_200._M_string_length._3_1_ = '\0';
      local_200._M_string_length._4_1_ = '\0';
      local_200._M_string_length._5_1_ = '\0';
      local_200._M_string_length._6_1_ = '\0';
      local_200._M_string_length._7_1_ = '\0';
      local_200.field_2._M_allocated_capacity = 0;
      local_200.field_2._8_8_ = 0;
    }
    local_200._M_dataplus._M_p._0_4_ = (uint)(local_21c.base.sa_family != 2);
    local_200._M_dataplus._M_p._4_4_ = (in_addr_t)local_21c.v4.sin_addr.s_addr;
    aux::print_address_abi_cxx11_(&local_1e0,(aux *)&local_200,addr);
    (*(ptVar5->super_request_callback)._vptr_request_callback[7])
              (ptVar5,"STORE BLOCK CRC [ p: %d | b: %d | c: %s | digest: %s | ip: %s ]",
               (ulong)pVar9 & 0xffffffff,uVar8,_Var18._M_p,local_240._M_dataplus._M_p,
               local_1e0._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_240);
    v1_2::peer_info::~peer_info(&info);
  }
LAB_00346a31:
  lcrypto::hasher::~hasher(&h);
  return;
}

Assistant:

void on_read_failed_block(piece_block const b, address const a
			, disk_buffer_holder buffer, int const block_size
			, storage_error const& error)
		{
			TORRENT_ASSERT(m_torrent.session().is_single_thread());

			// ignore read errors
			if (error) return;

			hasher h;
			h.update({buffer.data(), block_size});

			auto const range = m_torrent.find_peers(a);

			// there is no peer with this address anymore
			if (range.first == range.second) return;

			aux::torrent_peer* p = (*range.first);
			block_entry e = {p, h.final()};

			auto i = m_block_hashes.lower_bound(b);

			if (i != m_block_hashes.end() && i->first == b && i->second.peer == p)
			{
				// this peer has sent us this block before
				// if the peer is already banned, it doesn't matter if it sent
				// good or bad data. Nothings going to change it
				if (!p->banned && i->second.digest != e.digest)
				{
					// this time the digest of the block is different
					// from the first time it sent it
					// at least one of them must be bad
#ifndef TORRENT_DISABLE_LOGGING
					if (m_torrent.should_log())
					{
						char const* client = "-";
						peer_info info;
						if (p->connection)
						{
							p->connection->get_peer_info(info);
							client = info.client.c_str();
						}
						m_torrent.debug_log("BANNING PEER [ p: %d | b: %d | c: %s"
							" | hash1: %s | hash2: %s | ip: %s ]"
							, static_cast<int>(b.piece_index), b.block_index, client
							, aux::to_hex(i->second.digest).c_str()
							, aux::to_hex(e.digest).c_str()
							, aux::print_endpoint(p->ip()).c_str());
					}
#endif
					m_torrent.ban_peer(p);
					if (p->connection) p->connection->disconnect(
						errors::peer_banned, operation_t::bittorrent);
				}
				// we already have this exact entry in the map
				// we don't have to insert it
				return;
			}

			m_block_hashes.insert(i, std::pair<const piece_block, block_entry>(b, e));

#ifndef TORRENT_DISABLE_LOGGING
			if (m_torrent.should_log())
			{
				char const* client = "-";
				peer_info info;
				if (p->connection)
				{
					p->connection->get_peer_info(info);
					client = info.client.c_str();
				}
				m_torrent.debug_log("STORE BLOCK CRC [ p: %d | b: %d | c: %s"
					" | digest: %s | ip: %s ]"
					, static_cast<int>(b.piece_index), b.block_index, client
					, aux::to_hex(e.digest).c_str()
					, aux::print_address(p->ip().address()).c_str());
			}
#endif
		}